

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O1

void __thiscall
duckdb::StructColumnData::FetchRow
          (StructColumnData *this,TransactionData transaction,ColumnFetchState *state,row_t row_id,
          Vector *result,idx_t result_idx)

{
  vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_true>
  *this_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_01;
  reference pvVar1;
  type pCVar2;
  ColumnSegment *pCVar3;
  reference this_02;
  pointer pCVar4;
  reference this_03;
  type pVVar5;
  size_type __n;
  ulong uVar6;
  templated_unique_single_t child_state;
  __uniq_ptr_impl<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_> local_50
  ;
  DuckTransaction *local_48;
  transaction_t tStack_40;
  transaction_t local_38;
  
  this_01 = StructVector::GetEntries(result);
  this_00 = &state->child_states;
  uVar6 = (long)(state->child_states).
                super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(state->child_states).
                super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar6 < ((long)(this_01->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this_01->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) + 1U) {
    do {
      local_50._M_t.
      super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
      .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl =
           (tuple<duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>)
           operator_new(0x50);
      *(undefined8 *)
       local_50._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
       .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl = 0;
      *(size_type *)
       ((long)local_50._M_t.
              super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
              .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 8) = 0;
      *(undefined8 *)
       ((long)local_50._M_t.
              super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
              .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x20) = 0;
      *(size_t *)
       ((long)local_50._M_t.
              super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
              .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x28) = 0;
      *(__node_base_ptr *)
       ((long)local_50._M_t.
              super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
              .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x30) =
           (__node_base_ptr)0x0;
      (((vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_true>
         *)((long)local_50._M_t.
                  super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
                  .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x38))->
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      *(pointer *)
       ((long)local_50._M_t.
              super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
              .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x40) =
           (pointer)0x0;
      *(pointer *)
       ((long)local_50._M_t.
              super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
              .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x48) =
           (pointer)0x0;
      ((__node_base *)
      ((long)local_50._M_t.
             super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
             .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x10))->_M_nxt
           = (_Hash_node_base *)0x0;
      *(size_type *)
       ((long)local_50._M_t.
              super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
              .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x18) = 0;
      *(__node_base_ptr **)
       local_50._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
       .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl =
           (__node_base_ptr *)
           ((long)local_50._M_t.
                  super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
                  .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x30);
      *(size_type *)
       ((long)local_50._M_t.
              super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
              .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 8) = 1;
      ((_Prime_rehash_policy *)
      ((long)local_50._M_t.
             super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
             .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x20))->
      _M_max_load_factor = 1.0;
      *(size_t *)
       ((long)local_50._M_t.
              super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
              .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x28) = 0;
      *(__node_base_ptr *)
       ((long)local_50._M_t.
              super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
              .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x30) =
           (__node_base_ptr)0x0;
      (((vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_true>
         *)((long)local_50._M_t.
                  super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
                  .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x38))->
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      *(pointer *)
       ((long)local_50._M_t.
              super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
              .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x40) =
           (pointer)0x0;
      *(pointer *)
       ((long)local_50._M_t.
              super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
              .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x48) =
           (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>>>
                  *)this_00,
                 (unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
                  *)&local_50);
      ::std::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>::
      ~unique_ptr((unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>
                   *)&local_50);
      uVar6 = uVar6 + 1;
    } while (uVar6 < ((long)(this_01->
                            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                            ).
                            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_01->
                            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                            ).
                            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) + 1U);
  }
  pvVar1 = vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_true>
           ::operator[](this_00,0);
  pCVar2 = unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
           ::operator*(pvVar1);
  pCVar3 = SegmentTree<duckdb::ColumnSegment,_false>::GetSegment
                     (&(this->validity).super_ColumnData.data.
                       super_SegmentTree<duckdb::ColumnSegment,_false>,row_id);
  (*((pCVar3->function)._M_data)->fetch_row)
            (pCVar3,pCVar2,row_id - (pCVar3->super_SegmentBase<duckdb::ColumnSegment>).start,result,
             result_idx);
  ColumnData::FetchUpdateRow
            (&(this->validity).super_ColumnData,transaction,row_id,result,result_idx);
  if ((this_01->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this_01->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      this_02 = vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
                ::operator[](&this->sub_columns,__n);
      pCVar4 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
               operator->(this_02);
      local_48 = transaction.transaction.ptr;
      tStack_40 = transaction.transaction_id;
      local_38 = transaction.start_time;
      uVar6 = __n + 1;
      pvVar1 = vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_true>
               ::operator[](this_00,uVar6);
      pCVar2 = unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
               ::operator*(pvVar1);
      this_03 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::operator[](this_01,__n);
      pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (this_03);
      (*pCVar4->_vptr_ColumnData[0x16])
                (pCVar4,pCVar2,row_id,pVVar5,result_idx,pCVar4->_vptr_ColumnData,local_48._0_4_,
                 (undefined4)tStack_40,local_38);
      __n = uVar6;
    } while (uVar6 < (ulong)((long)(this_01->
                                   super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_01->
                                   super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void StructColumnData::FetchRow(TransactionData transaction, ColumnFetchState &state, row_t row_id, Vector &result,
                                idx_t result_idx) {
	// fetch validity mask
	auto &child_entries = StructVector::GetEntries(result);
	// insert any child states that are required
	for (idx_t i = state.child_states.size(); i < child_entries.size() + 1; i++) {
		auto child_state = make_uniq<ColumnFetchState>();
		state.child_states.push_back(std::move(child_state));
	}
	// fetch the validity state
	validity.FetchRow(transaction, *state.child_states[0], row_id, result, result_idx);
	// fetch the sub-column states
	for (idx_t i = 0; i < child_entries.size(); i++) {
		sub_columns[i]->FetchRow(transaction, *state.child_states[i + 1], row_id, *child_entries[i], result_idx);
	}
}